

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structurally_valid.cc
# Opt level: O1

char * __thiscall
google::protobuf::internal::UTF8CoerceToStructurallyValid
          (internal *this,StringPiece src_str,char *idst,char replace_char)

{
  char cVar1;
  int iVar2;
  internal *piVar3;
  int str_length;
  size_t sVar4;
  internal *piVar5;
  int bytes_consumed;
  int local_44;
  internal *local_40;
  int local_34;
  
  cVar1 = (anonymous_namespace)::module_initialized_;
  piVar5 = (internal *)src_str.length_;
  str_length = (int)src_str.ptr_;
  iVar2 = str_length;
  if ((anonymous_namespace)::module_initialized_ == '\x01') {
    local_34 = 0;
    UTF8GenericScanFastAscii
              ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,(char *)this,str_length,&local_34);
    iVar2 = local_34;
  }
  local_40 = this;
  if (iVar2 != str_length) {
    sVar4 = (size_t)iVar2;
    memmove(piVar5,this,sVar4);
    local_40 = piVar5;
    if ((long)sVar4 < (long)str_length) {
      piVar3 = this + sVar4;
      piVar5 = piVar5 + sVar4;
      do {
        *piVar5 = SUB81(idst,0);
        piVar3 = piVar3 + 1;
        iVar2 = (int)(this + str_length) - (int)piVar3;
        if (cVar1 != '\0') {
          local_44 = 0;
          UTF8GenericScanFastAscii
                    ((UTF8ScanObj *)utf8acceptnonsurrogates_obj,(char *)piVar3,iVar2,&local_44);
          iVar2 = local_44;
        }
        sVar4 = (size_t)iVar2;
        memmove(piVar5 + 1,piVar3,sVar4);
        piVar3 = piVar3 + sVar4;
        piVar5 = piVar5 + 1 + sVar4;
      } while (piVar3 < this + str_length);
    }
  }
  return (char *)local_40;
}

Assistant:

char* UTF8CoerceToStructurallyValid(StringPiece src_str, char* idst,
                                    const char replace_char) {
  const char* isrc = src_str.data();
  const int len = src_str.length();
  int n = UTF8SpnStructurallyValid(src_str);
  if (n == len) {               // Normal case -- all is cool, return
    return const_cast<char*>(isrc);
  } else {                      // Unusual case -- copy w/o bad bytes
    const char* src = isrc;
    const char* srclimit = isrc + len;
    char* dst = idst;
    memmove(dst, src, n);       // Copy initial good chunk
    src += n;
    dst += n;
    while (src < srclimit) {    // src points to bogus byte or is off the end
      dst[0] = replace_char;                    // replace one bad byte
      src++;
      dst++;
      StringPiece str2(src, srclimit - src);
      n = UTF8SpnStructurallyValid(str2);       // scan the remainder
      memmove(dst, src, n);                     // copy next good chunk
      src += n;
      dst += n;
    }
  }
  return idst;
}